

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_avx2.c
# Opt level: O1

void idct32_avx2(__m256i *in,__m256i *out,int bit,int do_cols,int bd,int out_shift)

{
  undefined4 uVar1;
  __m256i alVar2;
  __m256i alVar3;
  __m256i alVar4;
  __m256i alVar5;
  __m256i alVar6;
  __m256i alVar7;
  __m256i alVar8;
  __m256i alVar9;
  __m256i alVar10;
  __m256i alVar11;
  __m256i alVar12;
  __m256i alVar13;
  __m256i alVar14;
  __m256i alVar15;
  __m256i alVar16;
  __m256i alVar17;
  __m256i alVar18;
  undefined1 auVar19 [32];
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  byte bVar25;
  long lVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [16];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  __m256i clamp_hi_out;
  __m256i clamp_lo_out;
  int local_a0;
  int iStack_9c;
  int iStack_98;
  int iStack_94;
  int iStack_90;
  int iStack_8c;
  int iStack_88;
  int iStack_84;
  int local_80;
  int iStack_7c;
  int iStack_78;
  int iStack_74;
  int iStack_70;
  int iStack_6c;
  int iStack_68;
  int iStack_64;
  
  lVar26 = (long)bit * 0x100;
  iVar30 = *(int *)((long)vert_filter_length_chroma + lVar26 + 0x228);
  iVar23 = *(int *)((long)vert_filter_length_chroma + lVar26 + 0x1a8);
  iVar24 = *(int *)((long)vert_filter_length_chroma + lVar26 + 0x1e8);
  iVar28 = -iVar30;
  iVar20 = -iVar23;
  iVar21 = -iVar24;
  iVar27 = *(int *)((long)vert_filter_length_chroma + lVar26 + 0x168);
  iVar29 = 1 << ((char)bit - 1U & 0x1f);
  iVar22 = -iVar27;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar26 + 600);
  auVar64._4_4_ = uVar1;
  auVar64._0_4_ = uVar1;
  auVar64._8_4_ = uVar1;
  auVar64._12_4_ = uVar1;
  auVar64._16_4_ = uVar1;
  auVar64._20_4_ = uVar1;
  auVar64._24_4_ = uVar1;
  auVar64._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar26 + 0x1d8);
  auVar66._4_4_ = uVar1;
  auVar66._0_4_ = uVar1;
  auVar66._8_4_ = uVar1;
  auVar66._12_4_ = uVar1;
  auVar66._16_4_ = uVar1;
  auVar66._20_4_ = uVar1;
  auVar66._24_4_ = uVar1;
  auVar66._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar26 + 0x218);
  auVar70._4_4_ = uVar1;
  auVar70._0_4_ = uVar1;
  auVar70._8_4_ = uVar1;
  auVar70._12_4_ = uVar1;
  auVar70._16_4_ = uVar1;
  auVar70._20_4_ = uVar1;
  auVar70._24_4_ = uVar1;
  auVar70._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar26 + 0x198);
  auVar72._4_4_ = uVar1;
  auVar72._0_4_ = uVar1;
  auVar72._8_4_ = uVar1;
  auVar72._12_4_ = uVar1;
  auVar72._16_4_ = uVar1;
  auVar72._20_4_ = uVar1;
  auVar72._24_4_ = uVar1;
  auVar72._28_4_ = uVar1;
  auVar59._4_4_ = iVar28;
  auVar59._0_4_ = iVar28;
  auVar59._8_4_ = iVar28;
  auVar59._12_4_ = iVar28;
  auVar59._16_4_ = iVar28;
  auVar59._20_4_ = iVar28;
  auVar59._24_4_ = iVar28;
  auVar59._28_4_ = iVar28;
  auVar44._4_4_ = iVar20;
  auVar44._0_4_ = iVar20;
  auVar44._8_4_ = iVar20;
  auVar44._12_4_ = iVar20;
  auVar44._16_4_ = iVar20;
  auVar44._20_4_ = iVar20;
  auVar44._24_4_ = iVar20;
  auVar44._28_4_ = iVar20;
  auVar78._4_4_ = iVar21;
  auVar78._0_4_ = iVar21;
  auVar78._8_4_ = iVar21;
  auVar78._12_4_ = iVar21;
  auVar78._16_4_ = iVar21;
  auVar78._20_4_ = iVar21;
  auVar78._24_4_ = iVar21;
  auVar78._28_4_ = iVar21;
  auVar83._4_4_ = iVar22;
  auVar83._0_4_ = iVar22;
  auVar83._8_4_ = iVar22;
  auVar83._12_4_ = iVar22;
  auVar83._16_4_ = iVar22;
  auVar83._20_4_ = iVar22;
  auVar83._24_4_ = iVar22;
  auVar83._28_4_ = iVar22;
  auVar58._4_4_ = iVar29;
  auVar58._0_4_ = iVar29;
  auVar58._8_4_ = iVar29;
  auVar58._12_4_ = iVar29;
  auVar58._16_4_ = iVar29;
  auVar58._20_4_ = iVar29;
  auVar58._24_4_ = iVar29;
  auVar58._28_4_ = iVar29;
  auVar19 = vpmulld_avx2((undefined1  [32])in[1],auVar64);
  auVar83 = vpmulld_avx2((undefined1  [32])in[0x1f],auVar83);
  auVar19 = vpaddd_avx2(auVar19,auVar58);
  auVar19 = vpaddd_avx2(auVar19,auVar83);
  auVar83 = vpmulld_avx2((undefined1  [32])in[0x11],auVar66);
  auVar78 = vpmulld_avx2((undefined1  [32])in[0xf],auVar78);
  auVar83 = vpaddd_avx2(auVar83,auVar58);
  auVar83 = vpaddd_avx2(auVar83,auVar78);
  auVar78 = vpmulld_avx2((undefined1  [32])in[9],auVar70);
  auVar44 = vpmulld_avx2((undefined1  [32])in[0x17],auVar44);
  auVar78 = vpaddd_avx2(auVar78,auVar58);
  auVar78 = vpaddd_avx2(auVar78,auVar44);
  auVar45 = vpmulld_avx2((undefined1  [32])in[7],auVar59);
  auVar44 = vpmulld_avx2((undefined1  [32])in[0x19],auVar72);
  auVar44 = vpaddd_avx2(auVar44,auVar58);
  auVar44 = vpaddd_avx2(auVar44,auVar45);
  iVar20 = *(int *)((long)vert_filter_length_chroma + lVar26 + 0x188);
  iVar21 = -iVar20;
  auVar45._4_4_ = iVar21;
  auVar45._0_4_ = iVar21;
  auVar45._8_4_ = iVar21;
  auVar45._12_4_ = iVar21;
  auVar45._16_4_ = iVar21;
  auVar45._20_4_ = iVar21;
  auVar45._24_4_ = iVar21;
  auVar45._28_4_ = iVar21;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar26 + 0x238);
  auVar79._4_4_ = uVar1;
  auVar79._0_4_ = uVar1;
  auVar79._8_4_ = uVar1;
  auVar79._12_4_ = uVar1;
  auVar79._16_4_ = uVar1;
  auVar79._20_4_ = uVar1;
  auVar79._24_4_ = uVar1;
  auVar79._28_4_ = uVar1;
  auVar46 = vpmulld_avx2((undefined1  [32])in[0x1b],auVar45);
  auVar45 = vpmulld_avx2((undefined1  [32])in[5],auVar79);
  auVar45 = vpaddd_avx2(auVar45,auVar58);
  auVar45 = vpaddd_avx2(auVar45,auVar46);
  iVar21 = *(int *)((long)vert_filter_length_chroma + lVar26 + 0x208);
  iVar22 = -iVar21;
  auVar46._4_4_ = iVar22;
  auVar46._0_4_ = iVar22;
  auVar46._8_4_ = iVar22;
  auVar46._12_4_ = iVar22;
  auVar46._16_4_ = iVar22;
  auVar46._20_4_ = iVar22;
  auVar46._24_4_ = iVar22;
  auVar46._28_4_ = iVar22;
  auVar59 = vpmulld_avx2((undefined1  [32])in[0xb],auVar46);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar26 + 0x1b8);
  auVar67._4_4_ = uVar1;
  auVar67._0_4_ = uVar1;
  auVar67._8_4_ = uVar1;
  auVar67._12_4_ = uVar1;
  auVar67._16_4_ = uVar1;
  auVar67._20_4_ = uVar1;
  auVar67._24_4_ = uVar1;
  auVar67._28_4_ = uVar1;
  auVar46 = vpmulld_avx2((undefined1  [32])in[0x15],auVar67);
  auVar46 = vpaddd_avx2(auVar46,auVar58);
  auVar46 = vpaddd_avx2(auVar46,auVar59);
  iVar22 = *(int *)((long)vert_filter_length_chroma + lVar26 + 0x1c8);
  iVar28 = -iVar22;
  auVar85._4_4_ = iVar28;
  auVar85._0_4_ = iVar28;
  auVar85._8_4_ = iVar28;
  auVar85._12_4_ = iVar28;
  auVar85._16_4_ = iVar28;
  auVar85._20_4_ = iVar28;
  auVar85._24_4_ = iVar28;
  auVar85._28_4_ = iVar28;
  auVar85 = vpmulld_avx2((undefined1  [32])in[0x13],auVar85);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar26 + 0x1f8);
  auVar57._4_4_ = uVar1;
  auVar57._0_4_ = uVar1;
  auVar57._8_4_ = uVar1;
  auVar57._12_4_ = uVar1;
  auVar57._16_4_ = uVar1;
  auVar57._20_4_ = uVar1;
  auVar57._24_4_ = uVar1;
  auVar57._28_4_ = uVar1;
  auVar59 = vpmulld_avx2((undefined1  [32])in[0xd],auVar57);
  auVar59 = vpaddd_avx2(auVar59,auVar58);
  auVar59 = vpaddd_avx2(auVar59,auVar85);
  iVar28 = *(int *)((long)vert_filter_length_chroma + lVar26 + 0x248);
  iVar29 = -iVar28;
  auVar86._4_4_ = iVar29;
  auVar86._0_4_ = iVar29;
  auVar86._8_4_ = iVar29;
  auVar86._12_4_ = iVar29;
  auVar86._16_4_ = iVar29;
  auVar86._20_4_ = iVar29;
  auVar86._24_4_ = iVar29;
  auVar86._28_4_ = iVar29;
  auVar84 = vpmulld_avx2((undefined1  [32])in[3],auVar86);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar26 + 0x178);
  auVar47._4_4_ = uVar1;
  auVar47._0_4_ = uVar1;
  auVar47._8_4_ = uVar1;
  auVar47._12_4_ = uVar1;
  auVar47._16_4_ = uVar1;
  auVar47._20_4_ = uVar1;
  auVar47._24_4_ = uVar1;
  auVar47._28_4_ = uVar1;
  auVar85 = vpmulld_avx2((undefined1  [32])in[0x1d],auVar47);
  auVar85 = vpaddd_avx2(auVar85,auVar58);
  auVar85 = vpaddd_avx2(auVar85,auVar84);
  auVar84._4_4_ = iVar28;
  auVar84._0_4_ = iVar28;
  auVar84._8_4_ = iVar28;
  auVar84._12_4_ = iVar28;
  auVar84._16_4_ = iVar28;
  auVar84._20_4_ = iVar28;
  auVar84._24_4_ = iVar28;
  auVar84._28_4_ = iVar28;
  auVar84 = vpmulld_avx2((undefined1  [32])in[0x1d],auVar84);
  auVar32 = vpmulld_avx2((undefined1  [32])in[3],auVar47);
  auVar84 = vpaddd_avx2(auVar84,auVar58);
  auVar84 = vpaddd_avx2(auVar84,auVar32);
  auVar32._4_4_ = iVar22;
  auVar32._0_4_ = iVar22;
  auVar32._8_4_ = iVar22;
  auVar32._12_4_ = iVar22;
  auVar32._16_4_ = iVar22;
  auVar32._20_4_ = iVar22;
  auVar32._24_4_ = iVar22;
  auVar32._28_4_ = iVar22;
  auVar32 = vpmulld_avx2((undefined1  [32])in[0xd],auVar32);
  auVar33 = vpmulld_avx2((undefined1  [32])in[0x13],auVar57);
  auVar32 = vpaddd_avx2(auVar32,auVar58);
  auVar32 = vpaddd_avx2(auVar32,auVar33);
  auVar33._4_4_ = iVar21;
  auVar33._0_4_ = iVar21;
  auVar33._8_4_ = iVar21;
  auVar33._12_4_ = iVar21;
  auVar33._16_4_ = iVar21;
  auVar33._20_4_ = iVar21;
  auVar33._24_4_ = iVar21;
  auVar33._28_4_ = iVar21;
  auVar33 = vpmulld_avx2((undefined1  [32])in[0x15],auVar33);
  auVar34 = vpmulld_avx2((undefined1  [32])in[0xb],auVar67);
  auVar33 = vpaddd_avx2(auVar33,auVar58);
  auVar33 = vpaddd_avx2(auVar33,auVar34);
  auVar34._4_4_ = iVar20;
  auVar34._0_4_ = iVar20;
  auVar34._8_4_ = iVar20;
  auVar34._12_4_ = iVar20;
  auVar34._16_4_ = iVar20;
  auVar34._20_4_ = iVar20;
  auVar34._24_4_ = iVar20;
  auVar34._28_4_ = iVar20;
  auVar34 = vpmulld_avx2((undefined1  [32])in[5],auVar34);
  auVar35 = vpmulld_avx2((undefined1  [32])in[0x1b],auVar79);
  auVar34 = vpaddd_avx2(auVar34,auVar58);
  auVar34 = vpaddd_avx2(auVar34,auVar35);
  auVar35._4_4_ = iVar30;
  auVar35._0_4_ = iVar30;
  auVar35._8_4_ = iVar30;
  auVar35._12_4_ = iVar30;
  auVar35._16_4_ = iVar30;
  auVar35._20_4_ = iVar30;
  auVar35._24_4_ = iVar30;
  auVar35._28_4_ = iVar30;
  auVar35 = vpmulld_avx2((undefined1  [32])in[0x19],auVar35);
  auVar36 = vpmulld_avx2(auVar72,(undefined1  [32])in[7]);
  auVar35 = vpaddd_avx2(auVar35,auVar58);
  auVar35 = vpaddd_avx2(auVar35,auVar36);
  auVar36._4_4_ = iVar23;
  auVar36._0_4_ = iVar23;
  auVar36._8_4_ = iVar23;
  auVar36._12_4_ = iVar23;
  auVar36._16_4_ = iVar23;
  auVar36._20_4_ = iVar23;
  auVar36._24_4_ = iVar23;
  auVar36._28_4_ = iVar23;
  auVar36 = vpmulld_avx2(auVar36,(undefined1  [32])in[9]);
  auVar37 = vpmulld_avx2((undefined1  [32])in[0x17],auVar70);
  auVar36 = vpaddd_avx2(auVar36,auVar58);
  auVar36 = vpaddd_avx2(auVar36,auVar37);
  auVar37._4_4_ = iVar24;
  auVar37._0_4_ = iVar24;
  auVar37._8_4_ = iVar24;
  auVar37._12_4_ = iVar24;
  auVar37._16_4_ = iVar24;
  auVar37._20_4_ = iVar24;
  auVar37._24_4_ = iVar24;
  auVar37._28_4_ = iVar24;
  auVar37 = vpmulld_avx2(auVar37,(undefined1  [32])in[0x11]);
  auVar38 = vpmulld_avx2((undefined1  [32])in[0xf],auVar66);
  auVar37 = vpaddd_avx2(auVar37,auVar58);
  auVar37 = vpaddd_avx2(auVar37,auVar38);
  auVar38._4_4_ = iVar27;
  auVar38._0_4_ = iVar27;
  auVar38._8_4_ = iVar27;
  auVar38._12_4_ = iVar27;
  auVar38._16_4_ = iVar27;
  auVar38._20_4_ = iVar27;
  auVar38._24_4_ = iVar27;
  auVar38._28_4_ = iVar27;
  auVar38 = vpmulld_avx2(auVar38,(undefined1  [32])in[1]);
  auVar47 = vpmulld_avx2((undefined1  [32])in[0x1f],auVar64);
  auVar38 = vpaddd_avx2(auVar38,auVar58);
  auVar38 = vpaddd_avx2(auVar38,auVar47);
  iVar30 = *(int *)((long)vert_filter_length_chroma + lVar26 + 0x170);
  iVar23 = -iVar30;
  auVar48._4_4_ = iVar23;
  auVar48._0_4_ = iVar23;
  auVar48._8_4_ = iVar23;
  auVar48._12_4_ = iVar23;
  auVar48._16_4_ = iVar23;
  auVar48._20_4_ = iVar23;
  auVar48._24_4_ = iVar23;
  auVar48._28_4_ = iVar23;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar26 + 0x250);
  auVar76._4_4_ = uVar1;
  auVar76._0_4_ = uVar1;
  auVar76._8_4_ = uVar1;
  auVar76._12_4_ = uVar1;
  auVar76._16_4_ = uVar1;
  auVar76._20_4_ = uVar1;
  auVar76._24_4_ = uVar1;
  auVar76._28_4_ = uVar1;
  auVar48 = vpmulld_avx2((undefined1  [32])in[0x1e],auVar48);
  auVar47 = vpmulld_avx2((undefined1  [32])in[2],auVar76);
  auVar47 = vpaddd_avx2(auVar47,auVar58);
  auVar47 = vpaddd_avx2(auVar47,auVar48);
  iVar23 = *(int *)((long)vert_filter_length_chroma + lVar26 + 0x1f0);
  iVar24 = -iVar23;
  auVar49._4_4_ = iVar24;
  auVar49._0_4_ = iVar24;
  auVar49._8_4_ = iVar24;
  auVar49._12_4_ = iVar24;
  auVar49._16_4_ = iVar24;
  auVar49._20_4_ = iVar24;
  auVar49._24_4_ = iVar24;
  auVar49._28_4_ = iVar24;
  auVar49 = vpmulld_avx2((undefined1  [32])in[0xe],auVar49);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar26 + 0x1d0);
  auVar68._4_4_ = uVar1;
  auVar68._0_4_ = uVar1;
  auVar68._8_4_ = uVar1;
  auVar68._12_4_ = uVar1;
  auVar68._16_4_ = uVar1;
  auVar68._20_4_ = uVar1;
  auVar68._24_4_ = uVar1;
  auVar68._28_4_ = uVar1;
  auVar48 = vpmulld_avx2((undefined1  [32])in[0x12],auVar68);
  auVar48 = vpaddd_avx2(auVar48,auVar58);
  auVar48 = vpaddd_avx2(auVar48,auVar49);
  iVar24 = *(int *)((long)vert_filter_length_chroma + lVar26 + 0x1b0);
  iVar27 = -iVar24;
  auVar60._4_4_ = iVar27;
  auVar60._0_4_ = iVar27;
  auVar60._8_4_ = iVar27;
  auVar60._12_4_ = iVar27;
  auVar60._16_4_ = iVar27;
  auVar60._20_4_ = iVar27;
  auVar60._24_4_ = iVar27;
  auVar60._28_4_ = iVar27;
  auVar57 = vpmulld_avx2((undefined1  [32])in[0x16],auVar60);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar26 + 0x210);
  auVar73._4_4_ = uVar1;
  auVar73._0_4_ = uVar1;
  auVar73._8_4_ = uVar1;
  auVar73._12_4_ = uVar1;
  auVar73._16_4_ = uVar1;
  auVar73._20_4_ = uVar1;
  auVar73._24_4_ = uVar1;
  auVar73._28_4_ = uVar1;
  auVar49 = vpmulld_avx2((undefined1  [32])in[10],auVar73);
  auVar49 = vpaddd_avx2(auVar49,auVar58);
  auVar49 = vpaddd_avx2(auVar49,auVar57);
  iVar27 = *(int *)((long)vert_filter_length_chroma + lVar26 + 0x230);
  iVar20 = -iVar27;
  auVar61._4_4_ = iVar20;
  auVar61._0_4_ = iVar20;
  auVar61._8_4_ = iVar20;
  auVar61._12_4_ = iVar20;
  auVar61._16_4_ = iVar20;
  auVar61._20_4_ = iVar20;
  auVar61._24_4_ = iVar20;
  auVar61._28_4_ = iVar20;
  auVar60 = vpmulld_avx2((undefined1  [32])in[6],auVar61);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar26 + 400);
  auVar50._4_4_ = uVar1;
  auVar50._0_4_ = uVar1;
  auVar50._8_4_ = uVar1;
  auVar50._12_4_ = uVar1;
  auVar50._16_4_ = uVar1;
  auVar50._20_4_ = uVar1;
  auVar50._24_4_ = uVar1;
  auVar50._28_4_ = uVar1;
  auVar57 = vpmulld_avx2((undefined1  [32])in[0x1a],auVar50);
  auVar57 = vpaddd_avx2(auVar57,auVar58);
  auVar57 = vpaddd_avx2(auVar57,auVar60);
  auVar80._4_4_ = iVar27;
  auVar80._0_4_ = iVar27;
  auVar80._8_4_ = iVar27;
  auVar80._12_4_ = iVar27;
  auVar80._16_4_ = iVar27;
  auVar80._20_4_ = iVar27;
  auVar80._24_4_ = iVar27;
  auVar80._28_4_ = iVar27;
  auVar60 = vpmulld_avx2((undefined1  [32])in[0x1a],auVar80);
  auVar39 = vpmulld_avx2((undefined1  [32])in[6],auVar50);
  auVar60 = vpaddd_avx2(auVar60,auVar58);
  auVar60 = vpaddd_avx2(auVar60,auVar39);
  auVar39._4_4_ = iVar24;
  auVar39._0_4_ = iVar24;
  auVar39._8_4_ = iVar24;
  auVar39._12_4_ = iVar24;
  auVar39._16_4_ = iVar24;
  auVar39._20_4_ = iVar24;
  auVar39._24_4_ = iVar24;
  auVar39._28_4_ = iVar24;
  auVar39 = vpmulld_avx2((undefined1  [32])in[10],auVar39);
  auVar40 = vpmulld_avx2((undefined1  [32])in[0x16],auVar73);
  auVar39 = vpaddd_avx2(auVar39,auVar58);
  auVar39 = vpaddd_avx2(auVar39,auVar40);
  auVar40._4_4_ = iVar23;
  auVar40._0_4_ = iVar23;
  auVar40._8_4_ = iVar23;
  auVar40._12_4_ = iVar23;
  auVar40._16_4_ = iVar23;
  auVar40._20_4_ = iVar23;
  auVar40._24_4_ = iVar23;
  auVar40._28_4_ = iVar23;
  auVar40 = vpmulld_avx2((undefined1  [32])in[0x12],auVar40);
  auVar41 = vpmulld_avx2((undefined1  [32])in[0xe],auVar68);
  auVar40 = vpaddd_avx2(auVar40,auVar58);
  auVar40 = vpaddd_avx2(auVar40,auVar41);
  auVar41._4_4_ = iVar30;
  auVar41._0_4_ = iVar30;
  auVar41._8_4_ = iVar30;
  auVar41._12_4_ = iVar30;
  auVar41._16_4_ = iVar30;
  auVar41._20_4_ = iVar30;
  auVar41._24_4_ = iVar30;
  auVar41._28_4_ = iVar30;
  auVar41 = vpmulld_avx2((undefined1  [32])in[2],auVar41);
  auVar50 = vpsrad_avx2(auVar19,ZEXT416((uint)bit));
  auVar61 = vpsrad_avx2(auVar83,ZEXT416((uint)bit));
  auVar43 = ZEXT416((uint)bit);
  auVar64 = vpsrad_avx2(auVar78,auVar43);
  auVar44 = vpsrad_avx2(auVar44,auVar43);
  auVar45 = vpsrad_avx2(auVar45,auVar43);
  auVar46 = vpsrad_avx2(auVar46,auVar43);
  auVar43 = ZEXT416((uint)bit);
  auVar59 = vpsrad_avx2(auVar59,auVar43);
  auVar83 = vpmulld_avx2((undefined1  [32])in[0x1e],auVar76);
  auVar85 = vpsrad_avx2(auVar85,auVar43);
  auVar19 = vpaddd_avx2(auVar41,auVar58);
  auVar19 = vpaddd_avx2(auVar19,auVar83);
  auVar84 = vpsrad_avx2(auVar84,auVar43);
  auVar83 = vpaddd_avx2(auVar61,auVar50);
  auVar41 = vpsubd_avx2(auVar50,auVar61);
  auVar32 = vpsrad_avx2(auVar32,auVar43);
  auVar78 = vpaddd_avx2(auVar44,auVar64);
  auVar50 = vpsubd_avx2(auVar44,auVar64);
  auVar33 = vpsrad_avx2(auVar33,auVar43);
  auVar44 = vpaddd_avx2(auVar45,auVar46);
  auVar61 = vpsubd_avx2(auVar45,auVar46);
  auVar34 = vpsrad_avx2(auVar34,auVar43);
  auVar45 = vpaddd_avx2(auVar85,auVar59);
  auVar64 = vpsubd_avx2(auVar85,auVar59);
  auVar35 = vpsrad_avx2(auVar35,auVar43);
  auVar46 = vpaddd_avx2(auVar32,auVar84);
  auVar66 = vpsubd_avx2(auVar84,auVar32);
  auVar84 = vpsrad_avx2(auVar36,auVar43);
  auVar59 = vpaddd_avx2(auVar34,auVar33);
  auVar67 = vpsubd_avx2(auVar34,auVar33);
  auVar43 = ZEXT416((uint)bit);
  auVar32 = vpsrad_avx2(auVar37,auVar43);
  auVar85 = vpaddd_avx2(auVar84,auVar35);
  auVar68 = vpsubd_avx2(auVar35,auVar84);
  auVar33 = vpsrad_avx2(auVar38,auVar43);
  auVar84 = vpaddd_avx2(auVar33,auVar32);
  auVar70 = vpsubd_avx2(auVar33,auVar32);
  iVar30 = *(int *)((long)vert_filter_length_chroma + lVar26 + 0x240);
  iVar23 = *(int *)((long)vert_filter_length_chroma + lVar26 + 0x180);
  iVar24 = -iVar23;
  auVar54._4_4_ = iVar30;
  auVar54._0_4_ = iVar30;
  auVar54._8_4_ = iVar30;
  auVar54._12_4_ = iVar30;
  auVar54._16_4_ = iVar30;
  auVar54._20_4_ = iVar30;
  auVar54._24_4_ = iVar30;
  auVar54._28_4_ = iVar30;
  auVar77._4_4_ = iVar24;
  auVar77._0_4_ = iVar24;
  auVar77._8_4_ = iVar24;
  auVar77._12_4_ = iVar24;
  auVar77._16_4_ = iVar24;
  auVar77._20_4_ = iVar24;
  auVar77._24_4_ = iVar24;
  auVar77._28_4_ = iVar24;
  auVar32 = vpmulld_avx2((undefined1  [32])in[4],auVar54);
  auVar32 = vpaddd_avx2(auVar32,auVar58);
  auVar33 = vpmulld_avx2((undefined1  [32])in[0x1c],auVar77);
  auVar32 = vpaddd_avx2(auVar32,auVar33);
  iVar24 = *(int *)((long)vert_filter_length_chroma + lVar26 + 0x1c0);
  iVar27 = *(int *)((long)vert_filter_length_chroma + lVar26 + 0x200);
  iVar20 = -iVar27;
  auVar74._4_4_ = iVar24;
  auVar74._0_4_ = iVar24;
  auVar74._8_4_ = iVar24;
  auVar74._12_4_ = iVar24;
  auVar74._16_4_ = iVar24;
  auVar74._20_4_ = iVar24;
  auVar74._24_4_ = iVar24;
  auVar74._28_4_ = iVar24;
  auVar37 = vpsrad_avx2(auVar47,auVar43);
  auVar81._4_4_ = iVar20;
  auVar81._0_4_ = iVar20;
  auVar81._8_4_ = iVar20;
  auVar81._12_4_ = iVar20;
  auVar81._16_4_ = iVar20;
  auVar81._20_4_ = iVar20;
  auVar81._24_4_ = iVar20;
  auVar81._28_4_ = iVar20;
  auVar38 = vpsrad_avx2(auVar48,auVar43);
  auVar33 = vpmulld_avx2((undefined1  [32])in[0x14],auVar74);
  auVar33 = vpaddd_avx2(auVar33,auVar58);
  auVar34 = vpmulld_avx2((undefined1  [32])in[0xc],auVar81);
  auVar33 = vpaddd_avx2(auVar34,auVar33);
  auVar47 = vpsrad_avx2(auVar49,auVar43);
  auVar51._4_4_ = iVar27;
  auVar51._0_4_ = iVar27;
  auVar51._8_4_ = iVar27;
  auVar51._12_4_ = iVar27;
  auVar51._16_4_ = iVar27;
  auVar51._20_4_ = iVar27;
  auVar51._24_4_ = iVar27;
  auVar51._28_4_ = iVar27;
  auVar34 = vpmulld_avx2((undefined1  [32])in[0x14],auVar51);
  auVar35 = vpmulld_avx2((undefined1  [32])in[0xc],auVar74);
  auVar34 = vpaddd_avx2(auVar34,auVar58);
  auVar34 = vpaddd_avx2(auVar34,auVar35);
  auVar48 = vpsrad_avx2(auVar57,auVar43);
  auVar52._4_4_ = iVar23;
  auVar52._0_4_ = iVar23;
  auVar52._8_4_ = iVar23;
  auVar52._12_4_ = iVar23;
  auVar52._16_4_ = iVar23;
  auVar52._20_4_ = iVar23;
  auVar52._24_4_ = iVar23;
  auVar52._28_4_ = iVar23;
  auVar35 = vpmulld_avx2((undefined1  [32])in[4],auVar52);
  auVar36 = vpmulld_avx2((undefined1  [32])in[0x1c],auVar54);
  auVar35 = vpaddd_avx2(auVar35,auVar58);
  auVar35 = vpaddd_avx2(auVar35,auVar36);
  auVar49 = vpsrad_avx2(auVar60,auVar43);
  auVar36 = vpaddd_avx2(auVar38,auVar37);
  auVar60 = vpsubd_avx2(auVar37,auVar38);
  auVar57 = vpsrad_avx2(auVar39,auVar43);
  auVar37 = vpaddd_avx2(auVar47,auVar48);
  auVar39 = vpsubd_avx2(auVar48,auVar47);
  auVar47 = vpsrad_avx2(auVar40,auVar43);
  auVar38 = vpaddd_avx2(auVar57,auVar49);
  auVar49 = vpsubd_avx2(auVar49,auVar57);
  auVar48 = vpsrad_avx2(auVar19,auVar43);
  auVar19 = vpaddd_avx2(auVar48,auVar47);
  auVar47 = vpsubd_avx2(auVar48,auVar47);
  iVar30 = -iVar30;
  iVar24 = -iVar24;
  iVar23 = *(int *)((long)vert_filter_length_chroma + lVar26 + 0x1e0);
  iVar31 = -iVar23;
  iVar27 = *(int *)((long)vert_filter_length_chroma + lVar26 + 0x220);
  iVar29 = -iVar27;
  iVar20 = *(int *)((long)vert_filter_length_chroma + lVar26 + 0x1a0);
  iVar28 = -iVar20;
  iVar22 = bd + 6 + (uint)(do_cols == 0) * 2;
  iVar21 = 0x8000;
  if (0xf < iVar22) {
    iVar21 = 1 << ((char)iVar22 - 1U & 0x1f);
  }
  iVar22 = -iVar21;
  iVar21 = iVar21 + -1;
  auVar53._4_4_ = iVar22;
  auVar53._0_4_ = iVar22;
  auVar53._8_4_ = iVar22;
  auVar53._12_4_ = iVar22;
  auVar53._16_4_ = iVar22;
  auVar53._20_4_ = iVar22;
  auVar53._24_4_ = iVar22;
  auVar53._28_4_ = iVar22;
  auVar55._4_4_ = iVar21;
  auVar55._0_4_ = iVar21;
  auVar55._8_4_ = iVar21;
  auVar55._12_4_ = iVar21;
  auVar55._16_4_ = iVar21;
  auVar55._20_4_ = iVar21;
  auVar55._24_4_ = iVar21;
  auVar55._28_4_ = iVar21;
  auVar48 = vpmaxsd_avx2(auVar53,auVar41);
  auVar72 = vpminsd_avx2(auVar48,auVar55);
  auVar48 = vpmaxsd_avx2(auVar70,auVar53);
  auVar70 = vpminsd_avx2(auVar48,auVar55);
  auVar48 = vpmulld_avx2(auVar72,auVar77);
  auVar48 = vpaddd_avx2(auVar48,auVar58);
  auVar57 = vpmulld_avx2(auVar70,auVar54);
  auVar48 = vpaddd_avx2(auVar57,auVar48);
  auVar42._4_4_ = iVar30;
  auVar42._0_4_ = iVar30;
  auVar42._8_4_ = iVar30;
  auVar42._12_4_ = iVar30;
  auVar42._16_4_ = iVar30;
  auVar42._20_4_ = iVar30;
  auVar42._24_4_ = iVar30;
  auVar42._28_4_ = iVar30;
  auVar57 = vpmaxsd_avx2(auVar53,auVar50);
  auVar73 = vpminsd_avx2(auVar57,auVar55);
  auVar57 = vpmaxsd_avx2(auVar53,auVar68);
  auVar68 = vpminsd_avx2(auVar57,auVar55);
  auVar57 = vpmulld_avx2(auVar73,auVar42);
  auVar57 = vpaddd_avx2(auVar57,auVar58);
  auVar40 = vpmulld_avx2(auVar68,auVar77);
  auVar57 = vpaddd_avx2(auVar57,auVar40);
  auVar40 = vpmaxsd_avx2(auVar53,auVar61);
  auVar61 = vpminsd_avx2(auVar40,auVar55);
  auVar40 = vpmaxsd_avx2(auVar53,auVar67);
  auVar67 = vpminsd_avx2(auVar40,auVar55);
  auVar40 = vpmulld_avx2(auVar61,auVar81);
  auVar40 = vpaddd_avx2(auVar40,auVar58);
  auVar41 = vpmulld_avx2(auVar67,auVar74);
  auVar40 = vpaddd_avx2(auVar40,auVar41);
  auVar62._4_4_ = iVar24;
  auVar62._0_4_ = iVar24;
  auVar62._8_4_ = iVar24;
  auVar62._12_4_ = iVar24;
  auVar62._16_4_ = iVar24;
  auVar62._20_4_ = iVar24;
  auVar62._24_4_ = iVar24;
  auVar62._28_4_ = iVar24;
  auVar41 = vpmaxsd_avx2(auVar53,auVar64);
  auVar50 = vpminsd_avx2(auVar41,auVar55);
  auVar41 = vpmaxsd_avx2(auVar53,auVar66);
  auVar64 = vpminsd_avx2(auVar41,auVar55);
  auVar41 = vpmulld_avx2(auVar50,auVar62);
  auVar41 = vpaddd_avx2(auVar41,auVar58);
  auVar66 = vpmulld_avx2(auVar64,auVar81);
  auVar41 = vpaddd_avx2(auVar66,auVar41);
  auVar50 = vpmulld_avx2(auVar50,auVar81);
  auVar64 = vpmulld_avx2(auVar64,auVar74);
  auVar50 = vpaddd_avx2(auVar50,auVar58);
  auVar50 = vpaddd_avx2(auVar64,auVar50);
  auVar61 = vpmulld_avx2(auVar61,auVar74);
  auVar64 = vpmulld_avx2(auVar67,auVar51);
  auVar61 = vpaddd_avx2(auVar61,auVar58);
  auVar61 = vpaddd_avx2(auVar61,auVar64);
  auVar64 = vpmulld_avx2(auVar73,auVar77);
  auVar66 = vpmulld_avx2(auVar68,auVar54);
  auVar64 = vpaddd_avx2(auVar64,auVar58);
  auVar64 = vpaddd_avx2(auVar64,auVar66);
  auVar66 = vpmulld_avx2(auVar54,auVar72);
  auVar67 = vpmulld_avx2(auVar70,auVar52);
  auVar66 = vpaddd_avx2(auVar66,auVar58);
  auVar66 = vpaddd_avx2(auVar66,auVar67);
  auVar69._4_4_ = iVar23;
  auVar69._0_4_ = iVar23;
  auVar69._8_4_ = iVar23;
  auVar69._12_4_ = iVar23;
  auVar69._16_4_ = iVar23;
  auVar69._20_4_ = iVar23;
  auVar69._24_4_ = iVar23;
  auVar69._28_4_ = iVar23;
  auVar71._4_4_ = iVar31;
  auVar71._0_4_ = iVar31;
  auVar71._8_4_ = iVar31;
  auVar71._12_4_ = iVar31;
  auVar71._16_4_ = iVar31;
  auVar71._20_4_ = iVar31;
  auVar71._24_4_ = iVar31;
  auVar71._28_4_ = iVar31;
  auVar68 = vpmulld_avx2((undefined1  [32])*in,auVar69);
  auVar67 = vpaddd_avx2((undefined1  [32])in[0x10],(undefined1  [32])*in);
  auVar70 = vpmulld_avx2((undefined1  [32])in[0x10],auVar71);
  auVar68 = vpaddd_avx2(auVar68,auVar58);
  auVar68 = vpaddd_avx2(auVar68,auVar70);
  auVar75._4_4_ = iVar27;
  auVar75._0_4_ = iVar27;
  auVar75._8_4_ = iVar27;
  auVar75._12_4_ = iVar27;
  auVar75._16_4_ = iVar27;
  auVar75._20_4_ = iVar27;
  auVar75._24_4_ = iVar27;
  auVar75._28_4_ = iVar27;
  auVar63._4_4_ = iVar28;
  auVar63._0_4_ = iVar28;
  auVar63._8_4_ = iVar28;
  auVar63._12_4_ = iVar28;
  auVar63._16_4_ = iVar28;
  auVar63._20_4_ = iVar28;
  auVar63._24_4_ = iVar28;
  auVar63._28_4_ = iVar28;
  auVar70 = vpmulld_avx2((undefined1  [32])in[8],auVar75);
  auVar70 = vpaddd_avx2(auVar70,auVar58);
  auVar51 = vpmulld_avx2((undefined1  [32])in[0x18],auVar63);
  auVar70 = vpaddd_avx2(auVar51,auVar70);
  auVar65._4_4_ = iVar20;
  auVar65._0_4_ = iVar20;
  auVar65._8_4_ = iVar20;
  auVar65._12_4_ = iVar20;
  auVar65._16_4_ = iVar20;
  auVar65._20_4_ = iVar20;
  auVar65._24_4_ = iVar20;
  auVar65._28_4_ = iVar20;
  auVar51 = vpmulld_avx2((undefined1  [32])in[8],auVar65);
  auVar52 = vpmulld_avx2((undefined1  [32])in[0x18],auVar75);
  auVar51 = vpaddd_avx2(auVar51,auVar58);
  auVar51 = vpaddd_avx2(auVar51,auVar52);
  auVar52 = vpsrad_avx2(auVar32,auVar43);
  auVar33 = vpsrad_avx2(auVar33,auVar43);
  auVar32 = vpaddd_avx2(auVar33,auVar52);
  auVar54 = vpsubd_avx2(auVar52,auVar33);
  auVar34 = vpsrad_avx2(auVar34,auVar43);
  auVar35 = vpsrad_avx2(auVar35,auVar43);
  auVar33 = vpaddd_avx2(auVar35,auVar34);
  auVar72 = vpsubd_avx2(auVar35,auVar34);
  auVar34 = vpmaxsd_avx2(auVar53,auVar60);
  auVar60 = vpminsd_avx2(auVar34,auVar55);
  auVar34 = vpmaxsd_avx2(auVar53,auVar47);
  auVar52 = vpminsd_avx2(auVar34,auVar55);
  auVar34 = vpmulld_avx2(auVar60,auVar63);
  auVar34 = vpaddd_avx2(auVar34,auVar58);
  auVar35 = vpmulld_avx2(auVar52,auVar75);
  auVar34 = vpaddd_avx2(auVar34,auVar35);
  auVar82._4_4_ = iVar29;
  auVar82._0_4_ = iVar29;
  auVar82._8_4_ = iVar29;
  auVar82._12_4_ = iVar29;
  auVar82._16_4_ = iVar29;
  auVar82._20_4_ = iVar29;
  auVar82._24_4_ = iVar29;
  auVar82._28_4_ = iVar29;
  auVar35 = vpmaxsd_avx2(auVar53,auVar39);
  auVar47 = vpminsd_avx2(auVar35,auVar55);
  auVar35 = vpmaxsd_avx2(auVar53,auVar49);
  auVar49 = vpminsd_avx2(auVar35,auVar55);
  auVar35 = vpmulld_avx2(auVar47,auVar82);
  auVar35 = vpaddd_avx2(auVar35,auVar58);
  auVar39 = vpmulld_avx2(auVar49,auVar63);
  auVar35 = vpaddd_avx2(auVar35,auVar39);
  auVar47 = vpmulld_avx2(auVar47,auVar63);
  auVar49 = vpmulld_avx2(auVar49,auVar75);
  auVar47 = vpaddd_avx2(auVar47,auVar58);
  auVar47 = vpaddd_avx2(auVar49,auVar47);
  auVar49 = vpmulld_avx2(auVar60,auVar75);
  auVar60 = vpmulld_avx2(auVar52,auVar65);
  auVar49 = vpaddd_avx2(auVar49,auVar58);
  auVar49 = vpaddd_avx2(auVar49,auVar60);
  auVar83 = vpmaxsd_avx2(auVar53,auVar83);
  auVar60 = vpminsd_avx2(auVar83,auVar55);
  auVar83 = vpmaxsd_avx2(auVar53,auVar78);
  auVar78 = vpminsd_avx2(auVar83,auVar55);
  auVar83 = vpaddd_avx2(auVar78,auVar60);
  auVar52 = vpsubd_avx2(auVar60,auVar78);
  auVar48 = vpsrad_avx2(auVar48,auVar43);
  auVar57 = vpsrad_avx2(auVar57,auVar43);
  auVar78 = vpaddd_avx2(auVar57,auVar48);
  auVar73 = vpsubd_avx2(auVar48,auVar57);
  auVar44 = vpmaxsd_avx2(auVar53,auVar44);
  auVar48 = vpminsd_avx2(auVar44,auVar55);
  auVar44 = vpmaxsd_avx2(auVar53,auVar45);
  auVar45 = vpminsd_avx2(auVar44,auVar55);
  auVar44 = vpaddd_avx2(auVar45,auVar48);
  auVar74 = vpsubd_avx2(auVar45,auVar48);
  auVar43 = ZEXT416((uint)bit);
  auVar48 = vpsrad_avx2(auVar40,auVar43);
  auVar57 = vpsrad_avx2(auVar41,auVar43);
  auVar45 = vpaddd_avx2(auVar57,auVar48);
  auVar76 = vpsubd_avx2(auVar57,auVar48);
  auVar46 = vpmaxsd_avx2(auVar53,auVar46);
  auVar48 = vpminsd_avx2(auVar46,auVar55);
  auVar46 = vpmaxsd_avx2(auVar53,auVar59);
  auVar59 = vpminsd_avx2(auVar46,auVar55);
  auVar46 = vpaddd_avx2(auVar59,auVar48);
  auVar77 = vpsubd_avx2(auVar48,auVar59);
  auVar48 = vpsrad_avx2(auVar50,auVar43);
  auVar57 = vpsrad_avx2(auVar61,auVar43);
  auVar59 = vpaddd_avx2(auVar57,auVar48);
  auVar79 = vpsubd_avx2(auVar48,auVar57);
  auVar85 = vpmaxsd_avx2(auVar53,auVar85);
  auVar48 = vpminsd_avx2(auVar85,auVar55);
  auVar85 = vpmaxsd_avx2(auVar53,auVar84);
  auVar84 = vpminsd_avx2(auVar85,auVar55);
  auVar85 = vpaddd_avx2(auVar84,auVar48);
  auVar80 = vpsubd_avx2(auVar84,auVar48);
  auVar48 = vpsrad_avx2(auVar64,auVar43);
  auVar57 = vpsrad_avx2(auVar66,auVar43);
  auVar84 = vpaddd_avx2(auVar57,auVar48);
  auVar50 = vpsubd_avx2(auVar57,auVar48);
  auVar48 = vpmulld_avx2(auVar69,auVar67);
  auVar48 = vpaddd_avx2(auVar48,auVar58);
  auVar57 = vpsrad_avx2(auVar48,auVar43);
  auVar60 = vpsrad_avx2(auVar51,auVar43);
  auVar48 = vpaddd_avx2(auVar60,auVar57);
  auVar51 = vpsubd_avx2(auVar57,auVar60);
  auVar60 = vpsrad_avx2(auVar68,auVar43);
  auVar39 = vpsrad_avx2(auVar70,auVar43);
  auVar57 = vpaddd_avx2(auVar39,auVar60);
  auVar81 = vpsubd_avx2(auVar60,auVar39);
  auVar60 = vpmaxsd_avx2(auVar53,auVar54);
  auVar39 = vpminsd_avx2(auVar60,auVar55);
  auVar60 = vpmaxsd_avx2(auVar53,auVar72);
  auVar40 = vpminsd_avx2(auVar60,auVar55);
  auVar60 = vpmulld_avx2(auVar39,auVar71);
  auVar60 = vpaddd_avx2(auVar60,auVar58);
  auVar41 = vpmulld_avx2(auVar40,auVar69);
  auVar60 = vpaddd_avx2(auVar60,auVar41);
  auVar39 = vpaddd_avx2(auVar40,auVar39);
  auVar36 = vpmaxsd_avx2(auVar53,auVar36);
  auVar40 = vpminsd_avx2(auVar36,auVar55);
  auVar36 = vpmaxsd_avx2(auVar53,auVar37);
  auVar37 = vpsrad_avx2(auVar34,auVar43);
  auVar36 = vpminsd_avx2(auVar36,auVar55);
  auVar41 = vpsrad_avx2(auVar35,auVar43);
  auVar34 = vpaddd_avx2(auVar36,auVar40);
  auVar54 = vpsubd_avx2(auVar40,auVar36);
  auVar35 = vpaddd_avx2(auVar41,auVar37);
  auVar72 = vpsubd_avx2(auVar37,auVar41);
  auVar36 = vpmaxsd_avx2(auVar53,auVar38);
  auVar36 = vpminsd_avx2(auVar36,auVar55);
  auVar19 = vpmaxsd_avx2(auVar53,auVar19);
  auVar38 = vpsrad_avx2(auVar47,auVar43);
  auVar37 = vpminsd_avx2(auVar19,auVar55);
  auVar47 = vpsrad_avx2(auVar49,auVar43);
  auVar19 = vpaddd_avx2(auVar37,auVar36);
  auVar86 = vpsubd_avx2(auVar37,auVar36);
  auVar36 = vpaddd_avx2(auVar47,auVar38);
  auVar42 = vpsubd_avx2(auVar47,auVar38);
  auVar37 = vpmaxsd_avx2(auVar53,auVar73);
  auVar61 = vpminsd_avx2(auVar37,auVar55);
  auVar37 = vpmaxsd_avx2(auVar50,auVar53);
  auVar64 = vpminsd_avx2(auVar37,auVar55);
  auVar37 = vpmulld_avx2(auVar61,auVar63);
  auVar37 = vpaddd_avx2(auVar37,auVar58);
  auVar38 = vpmulld_avx2(auVar64,auVar75);
  auVar37 = vpaddd_avx2(auVar38,auVar37);
  auVar38 = vpmaxsd_avx2(auVar52,auVar53);
  auVar50 = vpminsd_avx2(auVar38,auVar55);
  auVar38 = vpmaxsd_avx2(auVar80,auVar53);
  auVar66 = vpminsd_avx2(auVar38,auVar55);
  auVar38 = vpmulld_avx2(auVar50,auVar63);
  auVar38 = vpaddd_avx2(auVar38,auVar58);
  auVar47 = vpmulld_avx2(auVar66,auVar75);
  auVar38 = vpaddd_avx2(auVar38,auVar47);
  auVar47 = vpmaxsd_avx2(auVar53,auVar74);
  auVar41 = vpminsd_avx2(auVar47,auVar55);
  auVar47 = vpmaxsd_avx2(auVar53,auVar77);
  auVar67 = vpminsd_avx2(auVar47,auVar55);
  auVar47 = vpmulld_avx2(auVar41,auVar82);
  auVar47 = vpaddd_avx2(auVar47,auVar58);
  auVar49 = vpmulld_avx2(auVar67,auVar63);
  auVar47 = vpaddd_avx2(auVar47,auVar49);
  auVar49 = vpmaxsd_avx2(auVar53,auVar76);
  auVar40 = vpminsd_avx2(auVar49,auVar55);
  auVar49 = vpmaxsd_avx2(auVar53,auVar79);
  auVar68 = vpminsd_avx2(auVar49,auVar55);
  auVar49 = vpmulld_avx2(auVar40,auVar82);
  auVar49 = vpaddd_avx2(auVar49,auVar58);
  auVar70 = vpmulld_avx2(auVar68,auVar63);
  auVar49 = vpaddd_avx2(auVar49,auVar70);
  auVar40 = vpmulld_avx2(auVar40,auVar63);
  auVar68 = vpmulld_avx2(auVar68,auVar75);
  auVar40 = vpaddd_avx2(auVar40,auVar58);
  auVar40 = vpaddd_avx2(auVar40,auVar68);
  auVar41 = vpmulld_avx2(auVar41,auVar63);
  auVar67 = vpmulld_avx2(auVar67,auVar75);
  auVar41 = vpaddd_avx2(auVar41,auVar58);
  auVar41 = vpaddd_avx2(auVar41,auVar67);
  auVar50 = vpmulld_avx2(auVar50,auVar75);
  auVar66 = vpmulld_avx2(auVar66,auVar65);
  auVar50 = vpaddd_avx2(auVar50,auVar58);
  auVar50 = vpaddd_avx2(auVar50,auVar66);
  auVar61 = vpmulld_avx2(auVar61,auVar75);
  auVar64 = vpmulld_avx2(auVar64,auVar65);
  auVar61 = vpaddd_avx2(auVar61,auVar58);
  auVar61 = vpaddd_avx2(auVar61,auVar64);
  auVar33 = vpmaxsd_avx2(auVar53,auVar33);
  auVar64 = vpminsd_avx2(auVar33,auVar55);
  auVar33 = vpmaxsd_avx2(auVar53,auVar48);
  auVar48 = vpminsd_avx2(auVar33,auVar55);
  auVar33 = vpaddd_avx2(auVar48,auVar64);
  auVar52 = vpsubd_avx2(auVar48,auVar64);
  auVar48 = vpmaxsd_avx2(auVar53,auVar57);
  auVar57 = vpminsd_avx2(auVar48,auVar55);
  auVar48 = vpmulld_avx2(auVar69,auVar39);
  auVar48 = vpaddd_avx2(auVar58,auVar48);
  auVar39 = vpsrad_avx2(auVar48,auVar43);
  auVar48 = vpaddd_avx2(auVar39,auVar57);
  auVar73 = vpsubd_avx2(auVar57,auVar39);
  auVar57 = vpmaxsd_avx2(auVar53,auVar81);
  auVar39 = vpsrad_avx2(auVar60,auVar43);
  auVar60 = vpminsd_avx2(auVar57,auVar55);
  auVar57 = vpaddd_avx2(auVar39,auVar60);
  auVar74 = vpsubd_avx2(auVar60,auVar39);
  auVar32 = vpmaxsd_avx2(auVar53,auVar32);
  auVar60 = vpminsd_avx2(auVar32,auVar55);
  auVar32 = vpmaxsd_avx2(auVar53,auVar51);
  auVar39 = vpminsd_avx2(auVar32,auVar55);
  auVar32 = vpaddd_avx2(auVar39,auVar60);
  auVar51 = vpsubd_avx2(auVar39,auVar60);
  auVar60 = vpmaxsd_avx2(auVar53,auVar72);
  auVar66 = vpminsd_avx2(auVar60,auVar55);
  auVar60 = vpmaxsd_avx2(auVar53,auVar42);
  auVar67 = vpminsd_avx2(auVar60,auVar55);
  auVar60 = vpmulld_avx2(auVar66,auVar71);
  auVar60 = vpaddd_avx2(auVar58,auVar60);
  auVar39 = vpmulld_avx2(auVar67,auVar69);
  auVar60 = vpaddd_avx2(auVar60,auVar39);
  auVar39 = vpmaxsd_avx2(auVar53,auVar54);
  auVar64 = vpminsd_avx2(auVar39,auVar55);
  auVar39 = vpmaxsd_avx2(auVar53,auVar86);
  auVar68 = vpminsd_avx2(auVar39,auVar55);
  auVar39 = vpmulld_avx2(auVar64,auVar71);
  auVar39 = vpaddd_avx2(auVar58,auVar39);
  auVar70 = vpmulld_avx2(auVar68,auVar69);
  auVar39 = vpaddd_avx2(auVar70,auVar39);
  auVar64 = vpaddd_avx2(auVar68,auVar64);
  auVar66 = vpaddd_avx2(auVar67,auVar66);
  auVar83 = vpmaxsd_avx2(auVar53,auVar83);
  auVar67 = vpminsd_avx2(auVar83,auVar55);
  auVar83 = vpmaxsd_avx2(auVar53,auVar44);
  auVar44 = vpminsd_avx2(auVar83,auVar55);
  auVar83 = vpaddd_avx2(auVar44,auVar67);
  auVar67 = vpsubd_avx2(auVar67,auVar44);
  auVar78 = vpmaxsd_avx2(auVar53,auVar78);
  auVar44 = vpminsd_avx2(auVar78,auVar55);
  auVar78 = vpmaxsd_avx2(auVar53,auVar45);
  auVar37 = vpsrad_avx2(auVar37,auVar43);
  auVar38 = vpsrad_avx2(auVar38,auVar43);
  auVar45 = vpminsd_avx2(auVar78,auVar55);
  auVar47 = vpsrad_avx2(auVar47,auVar43);
  auVar78 = vpaddd_avx2(auVar45,auVar44);
  auVar68 = vpsubd_avx2(auVar44,auVar45);
  auVar45 = vpsrad_avx2(auVar49,auVar43);
  auVar44 = vpaddd_avx2(auVar37,auVar45);
  auVar49 = vpsubd_avx2(auVar37,auVar45);
  auVar45 = vpaddd_avx2(auVar47,auVar38);
  auVar70 = vpsubd_avx2(auVar38,auVar47);
  auVar46 = vpmaxsd_avx2(auVar53,auVar46);
  auVar37 = vpminsd_avx2(auVar46,auVar55);
  auVar46 = vpmaxsd_avx2(auVar53,auVar85);
  auVar85 = vpminsd_avx2(auVar46,auVar55);
  auVar46 = vpaddd_avx2(auVar85,auVar37);
  auVar54 = vpsubd_avx2(auVar85,auVar37);
  auVar59 = vpmaxsd_avx2(auVar53,auVar59);
  auVar85 = vpminsd_avx2(auVar59,auVar55);
  auVar59 = vpmaxsd_avx2(auVar53,auVar84);
  auVar37 = vpsrad_avx2(auVar40,auVar43);
  auVar38 = vpsrad_avx2(auVar41,auVar43);
  auVar84 = vpminsd_avx2(auVar59,auVar55);
  auVar47 = vpsrad_avx2(auVar50,auVar43);
  auVar59 = vpaddd_avx2(auVar84,auVar85);
  auVar72 = vpsubd_avx2(auVar84,auVar85);
  auVar84 = vpsrad_avx2(auVar61,auVar43);
  auVar85 = vpaddd_avx2(auVar37,auVar84);
  auVar61 = vpsubd_avx2(auVar84,auVar37);
  auVar84 = vpaddd_avx2(auVar47,auVar38);
  auVar40 = vpsubd_avx2(auVar47,auVar38);
  auVar19 = vpmaxsd_avx2(auVar53,auVar19);
  auVar37 = vpminsd_avx2(auVar19,auVar55);
  auVar19 = vpmaxsd_avx2(auVar53,auVar33);
  auVar33 = vpminsd_avx2(auVar19,auVar55);
  auVar19 = vpaddd_avx2(auVar33,auVar37);
  auVar76 = vpsubd_avx2(auVar33,auVar37);
  auVar33 = vpmaxsd_avx2(auVar53,auVar36);
  auVar36 = vpminsd_avx2(auVar33,auVar55);
  auVar33 = vpmaxsd_avx2(auVar53,auVar48);
  auVar37 = vpminsd_avx2(auVar33,auVar55);
  auVar33 = vpaddd_avx2(auVar37,auVar36);
  auVar77 = vpsubd_avx2(auVar37,auVar36);
  auVar37 = vpmaxsd_avx2(auVar53,auVar57);
  auVar36 = vpmulld_avx2(auVar66,auVar69);
  auVar36 = vpaddd_avx2(auVar36,auVar58);
  auVar38 = vpsrad_avx2(auVar36,auVar43);
  auVar37 = vpminsd_avx2(auVar37,auVar55);
  auVar36 = vpaddd_avx2(auVar38,auVar37);
  auVar79 = vpsubd_avx2(auVar37,auVar38);
  auVar37 = vpmaxsd_avx2(auVar53,auVar32);
  auVar32 = vpmulld_avx2(auVar64,auVar69);
  auVar32 = vpaddd_avx2(auVar58,auVar32);
  auVar38 = vpsrad_avx2(auVar32,auVar43);
  auVar37 = vpminsd_avx2(auVar37,auVar55);
  auVar32 = vpaddd_avx2(auVar37,auVar38);
  auVar80 = vpsubd_avx2(auVar37,auVar38);
  auVar37 = vpmaxsd_avx2(auVar53,auVar51);
  auVar38 = vpminsd_avx2(auVar37,auVar55);
  auVar47 = vpsrad_avx2(auVar39,auVar43);
  auVar37 = vpaddd_avx2(auVar47,auVar38);
  auVar51 = vpsubd_avx2(auVar38,auVar47);
  auVar38 = vpmaxsd_avx2(auVar53,auVar74);
  auVar48 = vpsrad_avx2(auVar60,auVar43);
  auVar47 = vpminsd_avx2(auVar38,auVar55);
  auVar38 = vpaddd_avx2(auVar48,auVar47);
  auVar74 = vpsubd_avx2(auVar47,auVar48);
  auVar35 = vpmaxsd_avx2(auVar53,auVar35);
  auVar47 = vpminsd_avx2(auVar35,auVar55);
  auVar35 = vpmaxsd_avx2(auVar53,auVar73);
  auVar48 = vpminsd_avx2(auVar35,auVar55);
  auVar35 = vpaddd_avx2(auVar48,auVar47);
  auVar73 = vpsubd_avx2(auVar48,auVar47);
  auVar34 = vpmaxsd_avx2(auVar53,auVar34);
  auVar47 = vpminsd_avx2(auVar34,auVar55);
  auVar34 = vpmaxsd_avx2(auVar53,auVar52);
  auVar48 = vpminsd_avx2(auVar34,auVar55);
  auVar34 = vpaddd_avx2(auVar48,auVar47);
  auVar52 = vpsubd_avx2(auVar48,auVar47);
  auVar47 = vpmaxsd_avx2(auVar70,auVar53);
  auVar41 = vpminsd_avx2(auVar47,auVar55);
  auVar47 = vpmaxsd_avx2(auVar40,auVar53);
  auVar50 = vpminsd_avx2(auVar47,auVar55);
  auVar47 = vpmulld_avx2(auVar41,auVar71);
  auVar47 = vpaddd_avx2(auVar58,auVar47);
  auVar48 = vpmulld_avx2(auVar50,auVar69);
  auVar47 = vpaddd_avx2(auVar47,auVar48);
  auVar48 = vpmaxsd_avx2(auVar53,auVar49);
  auVar40 = vpminsd_avx2(auVar48,auVar55);
  auVar48 = vpmaxsd_avx2(auVar61,auVar53);
  auVar61 = vpminsd_avx2(auVar48,auVar55);
  auVar48 = vpmulld_avx2(auVar40,auVar71);
  auVar48 = vpaddd_avx2(auVar48,auVar58);
  auVar49 = vpmulld_avx2(auVar61,auVar69);
  auVar48 = vpaddd_avx2(auVar48,auVar49);
  auVar49 = vpmaxsd_avx2(auVar53,auVar68);
  auVar39 = vpminsd_avx2(auVar49,auVar55);
  auVar49 = vpmaxsd_avx2(auVar72,auVar53);
  auVar64 = vpminsd_avx2(auVar49,auVar55);
  auVar49 = vpmulld_avx2(auVar39,auVar71);
  auVar49 = vpaddd_avx2(auVar49,auVar58);
  auVar57 = vpmulld_avx2(auVar64,auVar69);
  auVar49 = vpaddd_avx2(auVar49,auVar57);
  auVar57 = vpmaxsd_avx2(auVar53,auVar67);
  auVar60 = vpminsd_avx2(auVar57,auVar55);
  auVar57 = vpmaxsd_avx2(auVar53,auVar54);
  auVar66 = vpminsd_avx2(auVar57,auVar55);
  auVar57 = vpmulld_avx2(auVar60,auVar71);
  auVar57 = vpaddd_avx2(auVar57,auVar58);
  auVar67 = vpmulld_avx2(auVar66,auVar69);
  auVar57 = vpaddd_avx2(auVar57,auVar67);
  auVar60 = vpaddd_avx2(auVar66,auVar60);
  auVar39 = vpaddd_avx2(auVar39,auVar64);
  auVar40 = vpaddd_avx2(auVar61,auVar40);
  auVar61 = vpsrad_avx2(auVar47,auVar43);
  auVar64 = vpsrad_avx2(auVar48,auVar43);
  auVar66 = vpsrad_avx2(auVar49,auVar43);
  auVar47 = vpaddd_avx2(auVar50,auVar41);
  auVar57 = vpsrad_avx2(auVar57,auVar43);
  auVar48 = vpmulld_avx2(auVar60,auVar69);
  auVar48 = vpaddd_avx2(auVar58,auVar48);
  auVar43 = ZEXT416((uint)bit);
  auVar60 = vpsrad_avx2(auVar48,auVar43);
  auVar48 = vpmulld_avx2(auVar39,auVar69);
  auVar48 = vpaddd_avx2(auVar58,auVar48);
  auVar39 = vpsrad_avx2(auVar48,auVar43);
  auVar48 = vpmulld_avx2(auVar40,auVar69);
  auVar49 = vpmulld_avx2(auVar47,auVar69);
  auVar47 = vpaddd_avx2(auVar58,auVar48);
  auVar48 = vpsrad_avx2(auVar47,auVar43);
  auVar47 = vpaddd_avx2(auVar49,auVar58);
  auVar49 = vpsrad_avx2(auVar47,auVar43);
  auVar46 = vpmaxsd_avx2(auVar53,auVar46);
  auVar46 = vpminsd_avx2(auVar46,auVar55);
  auVar19 = vpmaxsd_avx2(auVar53,auVar19);
  auVar47 = vpminsd_avx2(auVar19,auVar55);
  auVar19 = vpaddd_avx2(auVar47,auVar46);
  auVar46 = vpsubd_avx2(auVar47,auVar46);
  auVar19 = vpmaxsd_avx2(auVar19,auVar53);
  alVar2 = (__m256i)vpminsd_avx2(auVar19,auVar55);
  auVar19 = vpmaxsd_avx2(auVar46,auVar53);
  alVar3 = (__m256i)vpminsd_avx2(auVar19,auVar55);
  *out = alVar2;
  out[0x1f] = alVar3;
  auVar19 = vpmaxsd_avx2(auVar53,auVar59);
  auVar46 = vpminsd_avx2(auVar19,auVar55);
  auVar19 = vpmaxsd_avx2(auVar53,auVar33);
  auVar59 = vpminsd_avx2(auVar19,auVar55);
  auVar19 = vpaddd_avx2(auVar59,auVar46);
  auVar46 = vpsubd_avx2(auVar59,auVar46);
  auVar19 = vpmaxsd_avx2(auVar19,auVar53);
  alVar3 = (__m256i)vpminsd_avx2(auVar19,auVar55);
  auVar19 = vpmaxsd_avx2(auVar46,auVar53);
  alVar4 = (__m256i)vpminsd_avx2(auVar19,auVar55);
  out[1] = alVar3;
  out[0x1e] = alVar4;
  auVar19 = vpmaxsd_avx2(auVar53,auVar85);
  auVar46 = vpminsd_avx2(auVar19,auVar55);
  auVar19 = vpmaxsd_avx2(auVar53,auVar36);
  auVar59 = vpminsd_avx2(auVar19,auVar55);
  auVar19 = vpaddd_avx2(auVar59,auVar46);
  auVar46 = vpsubd_avx2(auVar59,auVar46);
  auVar19 = vpmaxsd_avx2(auVar19,auVar53);
  alVar4 = (__m256i)vpminsd_avx2(auVar19,auVar55);
  auVar19 = vpmaxsd_avx2(auVar46,auVar53);
  alVar5 = (__m256i)vpminsd_avx2(auVar19,auVar55);
  out[2] = alVar4;
  out[0x1d] = alVar5;
  auVar19 = vpmaxsd_avx2(auVar53,auVar84);
  auVar46 = vpminsd_avx2(auVar19,auVar55);
  auVar19 = vpmaxsd_avx2(auVar53,auVar32);
  auVar59 = vpminsd_avx2(auVar19,auVar55);
  auVar19 = vpaddd_avx2(auVar59,auVar46);
  auVar46 = vpsubd_avx2(auVar59,auVar46);
  auVar19 = vpmaxsd_avx2(auVar19,auVar53);
  alVar5 = (__m256i)vpminsd_avx2(auVar19,auVar55);
  auVar19 = vpmaxsd_avx2(auVar46,auVar53);
  alVar6 = (__m256i)vpminsd_avx2(auVar19,auVar55);
  out[3] = alVar5;
  out[0x1c] = alVar6;
  auVar19 = vpmaxsd_avx2(auVar53,auVar37);
  auVar46 = vpminsd_avx2(auVar19,auVar55);
  auVar19 = vpaddd_avx2(auVar49,auVar46);
  auVar46 = vpsubd_avx2(auVar46,auVar49);
  auVar19 = vpmaxsd_avx2(auVar19,auVar53);
  alVar6 = (__m256i)vpminsd_avx2(auVar19,auVar55);
  auVar19 = vpmaxsd_avx2(auVar46,auVar53);
  alVar7 = (__m256i)vpminsd_avx2(auVar19,auVar55);
  out[4] = alVar6;
  out[0x1b] = alVar7;
  auVar19 = vpmaxsd_avx2(auVar53,auVar38);
  auVar46 = vpminsd_avx2(auVar19,auVar55);
  auVar19 = vpaddd_avx2(auVar48,auVar46);
  auVar46 = vpsubd_avx2(auVar46,auVar48);
  auVar19 = vpmaxsd_avx2(auVar19,auVar53);
  alVar7 = (__m256i)vpminsd_avx2(auVar19,auVar55);
  auVar19 = vpmaxsd_avx2(auVar46,auVar53);
  alVar8 = (__m256i)vpminsd_avx2(auVar19,auVar55);
  out[5] = alVar7;
  out[0x1a] = alVar8;
  auVar19 = vpmaxsd_avx2(auVar53,auVar35);
  auVar46 = vpminsd_avx2(auVar19,auVar55);
  auVar19 = vpaddd_avx2(auVar39,auVar46);
  auVar46 = vpsubd_avx2(auVar46,auVar39);
  auVar19 = vpmaxsd_avx2(auVar19,auVar53);
  alVar8 = (__m256i)vpminsd_avx2(auVar19,auVar55);
  auVar19 = vpmaxsd_avx2(auVar46,auVar53);
  alVar9 = (__m256i)vpminsd_avx2(auVar19,auVar55);
  out[6] = alVar8;
  out[0x19] = alVar9;
  auVar19 = vpmaxsd_avx2(auVar53,auVar34);
  auVar46 = vpminsd_avx2(auVar19,auVar55);
  auVar19 = vpaddd_avx2(auVar60,auVar46);
  auVar46 = vpsubd_avx2(auVar46,auVar60);
  auVar19 = vpmaxsd_avx2(auVar19,auVar53);
  alVar9 = (__m256i)vpminsd_avx2(auVar19,auVar55);
  auVar19 = vpmaxsd_avx2(auVar46,auVar53);
  alVar10 = (__m256i)vpminsd_avx2(auVar19,auVar55);
  out[7] = alVar9;
  out[0x18] = alVar10;
  auVar19 = vpmaxsd_avx2(auVar53,auVar52);
  auVar46 = vpminsd_avx2(auVar19,auVar55);
  auVar19 = vpaddd_avx2(auVar57,auVar46);
  auVar46 = vpsubd_avx2(auVar46,auVar57);
  auVar19 = vpmaxsd_avx2(auVar19,auVar53);
  alVar10 = (__m256i)vpminsd_avx2(auVar19,auVar55);
  auVar19 = vpmaxsd_avx2(auVar46,auVar53);
  alVar11 = (__m256i)vpminsd_avx2(auVar19,auVar55);
  out[8] = alVar10;
  out[0x17] = alVar11;
  auVar19 = vpmaxsd_avx2(auVar53,auVar73);
  auVar46 = vpminsd_avx2(auVar19,auVar55);
  auVar19 = vpaddd_avx2(auVar66,auVar46);
  auVar46 = vpsubd_avx2(auVar46,auVar66);
  auVar19 = vpmaxsd_avx2(auVar19,auVar53);
  alVar11 = (__m256i)vpminsd_avx2(auVar19,auVar55);
  auVar19 = vpmaxsd_avx2(auVar46,auVar53);
  alVar12 = (__m256i)vpminsd_avx2(auVar19,auVar55);
  out[9] = alVar11;
  out[0x16] = alVar12;
  auVar19 = vpmaxsd_avx2(auVar53,auVar74);
  auVar46 = vpminsd_avx2(auVar19,auVar55);
  auVar19 = vpaddd_avx2(auVar64,auVar46);
  auVar46 = vpsubd_avx2(auVar46,auVar64);
  auVar19 = vpmaxsd_avx2(auVar19,auVar53);
  alVar12 = (__m256i)vpminsd_avx2(auVar19,auVar55);
  auVar19 = vpmaxsd_avx2(auVar46,auVar53);
  alVar13 = (__m256i)vpminsd_avx2(auVar19,auVar55);
  out[10] = alVar12;
  out[0x15] = alVar13;
  auVar19 = vpmaxsd_avx2(auVar53,auVar51);
  auVar46 = vpminsd_avx2(auVar19,auVar55);
  auVar19 = vpaddd_avx2(auVar61,auVar46);
  auVar46 = vpsubd_avx2(auVar46,auVar61);
  auVar19 = vpmaxsd_avx2(auVar19,auVar53);
  alVar13 = (__m256i)vpminsd_avx2(auVar19,auVar55);
  auVar19 = vpmaxsd_avx2(auVar46,auVar53);
  alVar14 = (__m256i)vpminsd_avx2(auVar19,auVar55);
  out[0xb] = alVar13;
  out[0x14] = alVar14;
  auVar19 = vpmaxsd_avx2(auVar53,auVar45);
  auVar45 = vpminsd_avx2(auVar19,auVar55);
  auVar19 = vpmaxsd_avx2(auVar53,auVar80);
  auVar46 = vpminsd_avx2(auVar19,auVar55);
  auVar19 = vpaddd_avx2(auVar46,auVar45);
  auVar45 = vpsubd_avx2(auVar46,auVar45);
  auVar19 = vpmaxsd_avx2(auVar19,auVar53);
  alVar14 = (__m256i)vpminsd_avx2(auVar19,auVar55);
  auVar19 = vpmaxsd_avx2(auVar45,auVar53);
  alVar15 = (__m256i)vpminsd_avx2(auVar19,auVar55);
  out[0xc] = alVar14;
  out[0x13] = alVar15;
  auVar19 = vpmaxsd_avx2(auVar53,auVar44);
  auVar44 = vpminsd_avx2(auVar19,auVar55);
  auVar19 = vpmaxsd_avx2(auVar53,auVar79);
  auVar45 = vpminsd_avx2(auVar19,auVar55);
  auVar19 = vpaddd_avx2(auVar45,auVar44);
  auVar44 = vpsubd_avx2(auVar45,auVar44);
  auVar19 = vpmaxsd_avx2(auVar19,auVar53);
  alVar15 = (__m256i)vpminsd_avx2(auVar19,auVar55);
  auVar19 = vpmaxsd_avx2(auVar44,auVar53);
  alVar16 = (__m256i)vpminsd_avx2(auVar19,auVar55);
  out[0xd] = alVar15;
  out[0x12] = alVar16;
  auVar19 = vpmaxsd_avx2(auVar53,auVar78);
  auVar78 = vpminsd_avx2(auVar19,auVar55);
  auVar19 = vpmaxsd_avx2(auVar53,auVar77);
  auVar44 = vpminsd_avx2(auVar19,auVar55);
  auVar19 = vpaddd_avx2(auVar44,auVar78);
  auVar78 = vpsubd_avx2(auVar44,auVar78);
  auVar19 = vpmaxsd_avx2(auVar19,auVar53);
  alVar16 = (__m256i)vpminsd_avx2(auVar19,auVar55);
  auVar19 = vpmaxsd_avx2(auVar78,auVar53);
  alVar17 = (__m256i)vpminsd_avx2(auVar19,auVar55);
  out[0xe] = alVar16;
  out[0x11] = alVar17;
  auVar19 = vpmaxsd_avx2(auVar53,auVar83);
  auVar83 = vpminsd_avx2(auVar19,auVar55);
  auVar19 = vpmaxsd_avx2(auVar53,auVar76);
  auVar78 = vpminsd_avx2(auVar19,auVar55);
  auVar19 = vpaddd_avx2(auVar78,auVar83);
  auVar83 = vpsubd_avx2(auVar78,auVar83);
  auVar19 = vpmaxsd_avx2(auVar19,auVar53);
  auVar83 = vpmaxsd_avx2(auVar83,auVar53);
  alVar17 = (__m256i)vpminsd_avx2(auVar19,auVar55);
  alVar18 = (__m256i)vpminsd_avx2(auVar83,auVar55);
  out[0xf] = alVar17;
  out[0x10] = alVar18;
  if (do_cols == 0) {
    bVar25 = 10;
    if (10 < bd) {
      bVar25 = (byte)bd;
    }
    local_a0 = 0x20 << (bVar25 & 0x1f);
    local_80 = -local_a0;
    local_a0 = local_a0 + -1;
    if (out_shift != 0) {
      iVar30 = 1 << ((char)out_shift - 1U & 0x1f);
      auVar56._4_4_ = iVar30;
      auVar56._0_4_ = iVar30;
      auVar56._8_4_ = iVar30;
      auVar56._12_4_ = iVar30;
      auVar56._16_4_ = iVar30;
      auVar56._20_4_ = iVar30;
      auVar56._24_4_ = iVar30;
      auVar56._28_4_ = iVar30;
      auVar19 = vpaddd_avx2((undefined1  [32])alVar2,auVar56);
      auVar83 = vpaddd_avx2((undefined1  [32])alVar3,auVar56);
      alVar2 = (__m256i)vpsrad_avx2(auVar19,ZEXT416((uint)out_shift));
      alVar3 = (__m256i)vpsrad_avx2(auVar83,ZEXT416((uint)out_shift));
      *out = alVar2;
      out[1] = alVar3;
      auVar19 = vpaddd_avx2(auVar56,(undefined1  [32])alVar4);
      auVar83 = vpaddd_avx2((undefined1  [32])alVar5,auVar56);
      auVar43 = ZEXT416((uint)out_shift);
      alVar2 = (__m256i)vpsrad_avx2(auVar19,auVar43);
      alVar3 = (__m256i)vpsrad_avx2(auVar83,auVar43);
      out[2] = alVar2;
      out[3] = alVar3;
      auVar19 = vpaddd_avx2(auVar56,(undefined1  [32])alVar6);
      auVar83 = vpaddd_avx2((undefined1  [32])alVar7,auVar56);
      alVar2 = (__m256i)vpsrad_avx2(auVar19,auVar43);
      alVar3 = (__m256i)vpsrad_avx2(auVar83,auVar43);
      out[4] = alVar2;
      out[5] = alVar3;
      auVar19 = vpaddd_avx2(auVar56,(undefined1  [32])alVar8);
      auVar83 = vpaddd_avx2((undefined1  [32])alVar9,auVar56);
      auVar43 = ZEXT416((uint)out_shift);
      alVar2 = (__m256i)vpsrad_avx2(auVar19,auVar43);
      alVar3 = (__m256i)vpsrad_avx2(auVar83,auVar43);
      out[6] = alVar2;
      out[7] = alVar3;
      auVar19 = vpaddd_avx2((undefined1  [32])alVar10,auVar56);
      auVar83 = vpaddd_avx2((undefined1  [32])alVar11,auVar56);
      alVar2 = (__m256i)vpsrad_avx2(auVar19,auVar43);
      alVar3 = (__m256i)vpsrad_avx2(auVar83,auVar43);
      out[8] = alVar2;
      out[9] = alVar3;
      auVar19 = vpaddd_avx2(auVar56,(undefined1  [32])alVar12);
      auVar83 = vpaddd_avx2((undefined1  [32])alVar13,auVar56);
      alVar2 = (__m256i)vpsrad_avx2(auVar19,auVar43);
      alVar3 = (__m256i)vpsrad_avx2(auVar83,auVar43);
      out[10] = alVar2;
      out[0xb] = alVar3;
      alVar2 = (__m256i)vpaddd_avx2((undefined1  [32])alVar14,auVar56);
      out[0xc] = alVar2;
      alVar3 = (__m256i)vpaddd_avx2((undefined1  [32])alVar15,auVar56);
      out[0xd] = alVar3;
      alVar4 = (__m256i)vpaddd_avx2((undefined1  [32])alVar16,auVar56);
      out[0xe] = alVar4;
      alVar5 = (__m256i)vpaddd_avx2((undefined1  [32])alVar17,auVar56);
      out[0xf] = alVar5;
      alVar2 = (__m256i)vpsrad_avx2((undefined1  [32])alVar2,auVar43);
      out[0xc] = alVar2;
      alVar2 = (__m256i)vpsrad_avx2((undefined1  [32])alVar3,auVar43);
      out[0xd] = alVar2;
      auVar43 = ZEXT416((uint)out_shift);
      alVar2 = (__m256i)vpsrad_avx2((undefined1  [32])alVar4,auVar43);
      alVar3 = (__m256i)vpsrad_avx2((undefined1  [32])alVar5,auVar43);
      out[0xe] = alVar2;
      out[0xf] = alVar3;
      alVar2 = (__m256i)vpaddd_avx2((undefined1  [32])alVar18,auVar56);
      out[0x10] = alVar2;
      auVar19 = vpaddd_avx2(auVar56,(undefined1  [32])out[0x11]);
      auVar83 = vpaddd_avx2(auVar56,(undefined1  [32])out[0x12]);
      auVar78 = vpaddd_avx2(auVar56,(undefined1  [32])out[0x13]);
      alVar2 = (__m256i)vpsrad_avx2((undefined1  [32])alVar2,auVar43);
      out[0x10] = alVar2;
      alVar2 = (__m256i)vpsrad_avx2(auVar19,auVar43);
      out[0x11] = alVar2;
      alVar2 = (__m256i)vpsrad_avx2(auVar83,auVar43);
      alVar3 = (__m256i)vpsrad_avx2(auVar78,auVar43);
      out[0x12] = alVar2;
      out[0x13] = alVar3;
      alVar2 = (__m256i)vpaddd_avx2(auVar56,(undefined1  [32])out[0x14]);
      out[0x14] = alVar2;
      alVar3 = (__m256i)vpaddd_avx2(auVar56,(undefined1  [32])out[0x15]);
      out[0x15] = alVar3;
      alVar4 = (__m256i)vpaddd_avx2(auVar56,(undefined1  [32])out[0x16]);
      out[0x16] = alVar4;
      auVar19 = vpaddd_avx2(auVar56,(undefined1  [32])out[0x17]);
      alVar2 = (__m256i)vpsrad_avx2((undefined1  [32])alVar2,auVar43);
      out[0x14] = alVar2;
      alVar2 = (__m256i)vpsrad_avx2((undefined1  [32])alVar3,auVar43);
      out[0x15] = alVar2;
      alVar2 = (__m256i)vpsrad_avx2((undefined1  [32])alVar4,auVar43);
      alVar3 = (__m256i)vpsrad_avx2(auVar19,auVar43);
      out[0x16] = alVar2;
      out[0x17] = alVar3;
      alVar2 = (__m256i)vpaddd_avx2(auVar56,(undefined1  [32])out[0x18]);
      out[0x18] = alVar2;
      alVar3 = (__m256i)vpaddd_avx2(auVar56,(undefined1  [32])out[0x19]);
      out[0x19] = alVar3;
      alVar4 = (__m256i)vpaddd_avx2(auVar56,(undefined1  [32])out[0x1a]);
      out[0x1a] = alVar4;
      auVar19 = vpaddd_avx2(auVar56,(undefined1  [32])out[0x1b]);
      alVar2 = (__m256i)vpsrad_avx2((undefined1  [32])alVar2,auVar43);
      out[0x18] = alVar2;
      alVar2 = (__m256i)vpsrad_avx2((undefined1  [32])alVar3,auVar43);
      out[0x19] = alVar2;
      alVar2 = (__m256i)vpsrad_avx2((undefined1  [32])alVar4,auVar43);
      alVar3 = (__m256i)vpsrad_avx2(auVar19,auVar43);
      out[0x1a] = alVar2;
      out[0x1b] = alVar3;
      alVar2 = (__m256i)vpaddd_avx2(auVar56,(undefined1  [32])out[0x1c]);
      out[0x1c] = alVar2;
      alVar3 = (__m256i)vpaddd_avx2(auVar56,(undefined1  [32])out[0x1d]);
      out[0x1d] = alVar3;
      alVar4 = (__m256i)vpaddd_avx2(auVar56,(undefined1  [32])out[0x1e]);
      out[0x1e] = alVar4;
      auVar19 = vpaddd_avx2(auVar56,(undefined1  [32])out[0x1f]);
      alVar2 = (__m256i)vpsrad_avx2((undefined1  [32])alVar2,auVar43);
      alVar3 = (__m256i)vpsrad_avx2((undefined1  [32])alVar3,auVar43);
      out[0x1c] = alVar2;
      out[0x1d] = alVar3;
      alVar2 = (__m256i)vpsrad_avx2((undefined1  [32])alVar4,ZEXT416((uint)out_shift));
      out[0x1e] = alVar2;
      alVar2 = (__m256i)vpsrad_avx2(auVar19,ZEXT416((uint)out_shift));
      out[0x1f] = alVar2;
    }
    iStack_9c = local_a0;
    iStack_98 = local_a0;
    iStack_94 = local_a0;
    iStack_90 = local_a0;
    iStack_8c = local_a0;
    iStack_88 = local_a0;
    iStack_84 = local_a0;
    iStack_7c = local_80;
    iStack_78 = local_80;
    iStack_74 = local_80;
    iStack_70 = local_80;
    iStack_6c = local_80;
    iStack_68 = local_80;
    iStack_64 = local_80;
    highbd_clamp_epi32_avx2(out,out,(__m256i *)&local_80,(__m256i *)&local_a0,0x20);
  }
  return;
}

Assistant:

static void idct32_avx2(const __m256i *input, __m256i *output) {
  const int32_t *cospi = cospi_arr(INV_COS_BIT);
  const __m256i _r = _mm256_set1_epi32(1 << (INV_COS_BIT - 1));

  __m256i cospi_p62_m02 = pair_set_w16_epi16(cospi[62], -cospi[2]);
  __m256i cospi_p02_p62 = pair_set_w16_epi16(cospi[2], cospi[62]);
  __m256i cospi_p30_m34 = pair_set_w16_epi16(cospi[30], -cospi[34]);
  __m256i cospi_p34_p30 = pair_set_w16_epi16(cospi[34], cospi[30]);
  __m256i cospi_p46_m18 = pair_set_w16_epi16(cospi[46], -cospi[18]);
  __m256i cospi_p18_p46 = pair_set_w16_epi16(cospi[18], cospi[46]);
  __m256i cospi_p14_m50 = pair_set_w16_epi16(cospi[14], -cospi[50]);
  __m256i cospi_p50_p14 = pair_set_w16_epi16(cospi[50], cospi[14]);
  __m256i cospi_p54_m10 = pair_set_w16_epi16(cospi[54], -cospi[10]);
  __m256i cospi_p10_p54 = pair_set_w16_epi16(cospi[10], cospi[54]);
  __m256i cospi_p22_m42 = pair_set_w16_epi16(cospi[22], -cospi[42]);
  __m256i cospi_p42_p22 = pair_set_w16_epi16(cospi[42], cospi[22]);
  __m256i cospi_p38_m26 = pair_set_w16_epi16(cospi[38], -cospi[26]);
  __m256i cospi_p26_p38 = pair_set_w16_epi16(cospi[26], cospi[38]);
  __m256i cospi_p06_m58 = pair_set_w16_epi16(cospi[6], -cospi[58]);
  __m256i cospi_p58_p06 = pair_set_w16_epi16(cospi[58], cospi[6]);
  __m256i cospi_p60_m04 = pair_set_w16_epi16(cospi[60], -cospi[4]);
  __m256i cospi_p04_p60 = pair_set_w16_epi16(cospi[4], cospi[60]);
  __m256i cospi_p28_m36 = pair_set_w16_epi16(cospi[28], -cospi[36]);
  __m256i cospi_p36_p28 = pair_set_w16_epi16(cospi[36], cospi[28]);
  __m256i cospi_p44_m20 = pair_set_w16_epi16(cospi[44], -cospi[20]);
  __m256i cospi_p20_p44 = pair_set_w16_epi16(cospi[20], cospi[44]);
  __m256i cospi_p12_m52 = pair_set_w16_epi16(cospi[12], -cospi[52]);
  __m256i cospi_p52_p12 = pair_set_w16_epi16(cospi[52], cospi[12]);
  __m256i cospi_p56_m08 = pair_set_w16_epi16(cospi[56], -cospi[8]);
  __m256i cospi_p08_p56 = pair_set_w16_epi16(cospi[8], cospi[56]);
  __m256i cospi_p24_m40 = pair_set_w16_epi16(cospi[24], -cospi[40]);
  __m256i cospi_p40_p24 = pair_set_w16_epi16(cospi[40], cospi[24]);
  __m256i cospi_p32_p32 = pair_set_w16_epi16(cospi[32], cospi[32]);
  __m256i cospi_p32_m32 = pair_set_w16_epi16(cospi[32], -cospi[32]);
  __m256i cospi_p48_m16 = pair_set_w16_epi16(cospi[48], -cospi[16]);
  __m256i cospi_p16_p48 = pair_set_w16_epi16(cospi[16], cospi[48]);

  // stage 1
  __m256i x1[32];
  x1[0] = input[0];
  x1[1] = input[16];
  x1[2] = input[8];
  x1[3] = input[24];
  x1[4] = input[4];
  x1[5] = input[20];
  x1[6] = input[12];
  x1[7] = input[28];
  x1[8] = input[2];
  x1[9] = input[18];
  x1[10] = input[10];
  x1[11] = input[26];
  x1[12] = input[6];
  x1[13] = input[22];
  x1[14] = input[14];
  x1[15] = input[30];
  x1[16] = input[1];
  x1[17] = input[17];
  x1[18] = input[9];
  x1[19] = input[25];
  x1[20] = input[5];
  x1[21] = input[21];
  x1[22] = input[13];
  x1[23] = input[29];
  x1[24] = input[3];
  x1[25] = input[19];
  x1[26] = input[11];
  x1[27] = input[27];
  x1[28] = input[7];
  x1[29] = input[23];
  x1[30] = input[15];
  x1[31] = input[31];

  // stage 2
  btf_16_w16_avx2(cospi_p62_m02, cospi_p02_p62, &x1[16], &x1[31], _r,
                  INV_COS_BIT);
  btf_16_w16_avx2(cospi_p30_m34, cospi_p34_p30, &x1[17], &x1[30], _r,
                  INV_COS_BIT);
  btf_16_w16_avx2(cospi_p46_m18, cospi_p18_p46, &x1[18], &x1[29], _r,
                  INV_COS_BIT);
  btf_16_w16_avx2(cospi_p14_m50, cospi_p50_p14, &x1[19], &x1[28], _r,
                  INV_COS_BIT);
  btf_16_w16_avx2(cospi_p54_m10, cospi_p10_p54, &x1[20], &x1[27], _r,
                  INV_COS_BIT);
  btf_16_w16_avx2(cospi_p22_m42, cospi_p42_p22, &x1[21], &x1[26], _r,
                  INV_COS_BIT);
  btf_16_w16_avx2(cospi_p38_m26, cospi_p26_p38, &x1[22], &x1[25], _r,
                  INV_COS_BIT);
  btf_16_w16_avx2(cospi_p06_m58, cospi_p58_p06, &x1[23], &x1[24], _r,
                  INV_COS_BIT);

  // stage 3
  btf_16_w16_avx2(cospi_p60_m04, cospi_p04_p60, &x1[8], &x1[15], _r,
                  INV_COS_BIT);
  btf_16_w16_avx2(cospi_p28_m36, cospi_p36_p28, &x1[9], &x1[14], _r,
                  INV_COS_BIT);
  btf_16_w16_avx2(cospi_p44_m20, cospi_p20_p44, &x1[10], &x1[13], _r,
                  INV_COS_BIT);
  btf_16_w16_avx2(cospi_p12_m52, cospi_p52_p12, &x1[11], &x1[12], _r,
                  INV_COS_BIT);
  idct32_high16_stage3_avx2(x1);

  // stage 4
  btf_16_w16_avx2(cospi_p56_m08, cospi_p08_p56, &x1[4], &x1[7], _r,
                  INV_COS_BIT);
  btf_16_w16_avx2(cospi_p24_m40, cospi_p40_p24, &x1[5], &x1[6], _r,
                  INV_COS_BIT);
  btf_16_adds_subs_avx2(&x1[8], &x1[9]);
  btf_16_adds_subs_avx2(&x1[11], &x1[10]);
  btf_16_adds_subs_avx2(&x1[12], &x1[13]);
  btf_16_adds_subs_avx2(&x1[15], &x1[14]);
  idct32_high16_stage4_avx2(x1, cospi, _r, INV_COS_BIT);

  // stage 5
  btf_16_w16_avx2(cospi_p32_p32, cospi_p32_m32, &x1[0], &x1[1], _r,
                  INV_COS_BIT);
  btf_16_w16_avx2(cospi_p48_m16, cospi_p16_p48, &x1[2], &x1[3], _r,
                  INV_COS_BIT);
  btf_16_adds_subs_avx2(&x1[4], &x1[5]);
  btf_16_adds_subs_avx2(&x1[7], &x1[6]);
  idct32_high24_stage5_avx2(x1, cospi, _r, INV_COS_BIT);

  // stage 6
  btf_16_adds_subs_avx2(&x1[0], &x1[3]);
  btf_16_adds_subs_avx2(&x1[1], &x1[2]);
  idct32_high28_stage6_avx2(x1, cospi, _r, INV_COS_BIT);

  idct32_stage7_avx2(x1, cospi, _r, INV_COS_BIT);
  idct32_stage8_avx2(x1, cospi, _r, INV_COS_BIT);
  idct32_stage9_avx2(output, x1);
}